

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::
ContainerEqMatcher<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>>
::
MatchAndExplain<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>>
          (ContainerEqMatcher<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>>
           *this,sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                 *lhs,MatchResultListener *listener)

{
  ostream *this_00;
  size_type sVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  const_reference piVar5;
  ulong uVar6;
  long lVar7;
  size_type_conflict sVar8;
  ulong uVar9;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  begin;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  end;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  end_00;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  cVar10;
  char *local_38;
  
  bVar3 = google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::
          operator==(lhs,(sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                          *)this);
  if ((!bVar3) && (this_00 = listener->stream_, this_00 != (ostream *)0x0)) {
    if ((lhs->settings).table_size == 0) {
      local_38 = "which";
    }
    else {
      bVar4 = false;
      uVar9 = 0;
      do {
        uVar6 = uVar9 / 0x30;
        sVar1 = *(size_type *)(this + 0x18);
        sVar8 = (short)uVar6 * -0x30 + (short)uVar9;
        piVar5 = google::
                 sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::
                 get((lhs->groups).
                     super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar6,sVar8);
        cVar10.pos = 0;
        cVar10.table = (sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                        *)this;
        end.pos = sVar1;
        end.table = (sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                     *)this;
        cVar10 = ArrayAwareFind<google::const_table_iterator<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>>,int>
                           (cVar10,end,piVar5);
        if ((cVar10.table ==
             (sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)this
            ) && (cVar10.pos == *(size_type *)(this + 0x18))) {
          if (bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>(this_00,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (this_00,"which has these unexpected elements: ",0x25);
            bVar4 = true;
          }
          piVar5 = google::
                   sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::
                   get((lhs->groups).
                       super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar6,sVar8);
          std::ostream::operator<<((ostream *)this_00,*piVar5);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != (lhs->settings).table_size);
      local_38 = "which";
      if (bVar4) {
        local_38 = ",\nand";
      }
    }
    if (*(long *)(this + 0x18) != 0) {
      bVar4 = false;
      uVar9 = 0;
      do {
        sVar2 = (lhs->settings).table_size;
        lVar7 = (uVar9 / 0x30) * 0x10;
        sVar8 = (short)(uVar9 / 0x30) * -0x30 + (short)uVar9;
        piVar5 = google::
                 sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::
                 get((sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                      *)(*(long *)this + lVar7),sVar8);
        begin.pos = 0;
        begin.table = lhs;
        end_00.pos = sVar2;
        end_00.table = lhs;
        cVar10 = ArrayAwareFind<google::const_table_iterator<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>>,int>
                           (begin,end_00,piVar5);
        if ((cVar10.table == lhs) && (cVar10.pos == (lhs->settings).table_size)) {
          if (bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>(this_00,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(this_00,local_38,5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (this_00," doesn\'t have these expected elements: ",0x27);
            bVar4 = true;
          }
          piVar5 = google::
                   sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::
                   get((sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                        *)(lVar7 + *(long *)this),sVar8);
          std::ostream::operator<<((ostream *)this_00,*piVar5);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != *(ulong *)(this + 0x18));
    }
  }
  return bVar3;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_) return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (auto it = lhs_stl_container.begin(); it != lhs_stl_container.end();
           ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (auto it = expected_.begin(); it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(lhs_stl_container.begin(),
                                     lhs_stl_container.end(),
                                     *it) == lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }